

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf_crc.hpp
# Opt level: O0

void __thiscall
bf_crc::bf_crc(bf_crc *this,uint16_t crc_width,uint32_t polynomial,bool probe_final_xor,
              uint32_t final_xor,bool probe_initial,uint32_t initial,bool probe_reflected_input,
              bool probe_reflected_output,FEED_TYPE feed_type)

{
  byte in_CL;
  uint uVar1;
  long in_RDI;
  byte in_R9B;
  uint uVar2;
  byte in_stack_00000010;
  byte in_stack_00000018;
  uint32_t in_stack_00000020;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_32;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_31;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_30;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_29;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_28;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_27;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_26;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_25;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_24;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_23;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_22;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_21;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_20;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_19;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_18;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_17;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_16;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_15;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_14;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_13;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_12;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_11;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_10;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_9;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_8;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_7;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_6;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_5;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_4;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_3;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_2;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_1;
  vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> crc_0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff4fc;
  undefined4 in_stack_fffffffffffff504;
  undefined1 in_stack_fffffffffffff50c;
  undefined1 in_stack_fffffffffffff50d;
  undefined1 in_stack_fffffffffffff50e;
  undefined1 in_stack_fffffffffffff50f;
  undefined4 in_stack_fffffffffffff514;
  uint32_t in_stack_fffffffffffff518;
  uint16_t in_stack_fffffffffffff51e;
  bf_crc *in_stack_fffffffffffff520;
  uint32_t in_stack_fffffffffffff530;
  FEED_TYPE in_stack_fffffffffffff548;
  mutex *in_stack_fffffffffffff550;
  crc_model_ local_a38;
  crc_model_ local_a24;
  crc_model_ local_a10;
  crc_model_ local_9fc;
  crc_model_ local_9e8;
  crc_model_ local_9d4;
  crc_model_ local_9c0;
  crc_model_ local_9ac;
  crc_model_ local_998;
  crc_model_ local_984 [2];
  crc_model_ local_954 [2];
  crc_model_ local_924 [8];
  crc_model_ local_87c;
  crc_model_ local_868;
  crc_model_ local_854;
  crc_model_ local_840;
  crc_model_ local_82c;
  crc_model_ local_818;
  crc_model_ local_804 [10];
  crc_model_ local_730;
  crc_model_ local_71c;
  crc_model_ local_708;
  crc_model_ local_6f4;
  crc_model_ local_6e0;
  crc_model_ local_6cc;
  crc_model_ local_6b8;
  crc_model_ local_6a4;
  crc_model_ local_690;
  crc_model_ local_67c;
  crc_model_ local_668;
  crc_model_ local_654;
  crc_model_ local_640;
  crc_model_ local_62c;
  crc_model_ local_618;
  crc_model_ local_604;
  crc_model_ local_5f0;
  crc_model_ local_5dc;
  crc_model_ local_5c8;
  crc_model_ local_5b4;
  crc_model_ local_5a0;
  crc_model_ local_58c;
  crc_model_ local_578;
  crc_model_ local_564;
  crc_model_ local_550;
  crc_model_ local_53c;
  crc_model_ local_528;
  crc_model_ local_514 [2];
  crc_model_ local_4e8;
  crc_model_ local_4d4 [2];
  crc_model_ local_4a4 [2];
  crc_model_ local_474 [2];
  crc_model_ local_444;
  crc_model_ local_430;
  crc_model_ local_41c [2];
  crc_model_ local_3f0;
  crc_model_ local_3dc [2];
  crc_model_ local_3ac;
  crc_model_ local_398;
  crc_model_ local_384 [3];
  crc_model_ local_340;
  crc_model_ local_32c;
  crc_model_ local_318;
  crc_model_ local_304;
  crc_model_ local_2f0;
  crc_model_ local_2dc;
  crc_model_ local_2c8;
  crc_model_ local_2b4;
  crc_model_ local_2a0;
  crc_model_ local_28c;
  crc_model_ local_278;
  crc_model_ local_264;
  crc_model_ local_250;
  crc_model_ local_23c [2];
  crc_model_ local_20c;
  crc_model_ local_1f8;
  crc_model_ local_1e4 [2];
  crc_model_ local_1b8;
  crc_model_ local_1a4;
  crc_model_ local_190;
  crc_model_ local_17c [2];
  crc_model_ local_14c;
  crc_model_ local_138;
  crc_model_ local_124 [2];
  crc_model_ local_f8;
  crc_model_ local_e4 [2];
  crc_model_ local_b4 [6];
  byte local_2b;
  byte local_2a;
  byte local_29;
  byte local_21;
  
  local_21 = in_CL & 1;
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000010 & 1;
  local_2b = in_stack_00000018 & 1;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a5fd);
  boost::mutex::mutex(in_stack_fffffffffffff550);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::vector((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
            *)0x19a634);
  uVar1 = local_2b & 1;
  uVar2 = local_2a & 1;
  set_parameters(in_stack_fffffffffffff520,in_stack_fffffffffffff51e,in_stack_fffffffffffff518,
                 SUB41((uint)in_stack_fffffffffffff514 >> 0x18,0),in_stack_00000020,
                 (bool)in_stack_fffffffffffff50f,in_stack_fffffffffffff530,
                 (bool)in_stack_fffffffffffff50e,(bool)in_stack_fffffffffffff50d,
                 in_stack_fffffffffffff548);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::clear
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a6ba);
  *(undefined1 *)(in_RDI + 0x38) = 0;
  *(undefined1 *)(in_RDI + 0x39) = 0;
  *(undefined1 *)(in_RDI + 0x25) = 0;
  *(undefined1 *)(in_RDI + 0x27) = 0;
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a6e7);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a71a);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a74d);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a778);
  uVar3 = 0;
  crc_model_::crc_model_(local_b4,3,7,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a7e5);
  uVar3 = 0;
  crc_model_::crc_model_(local_e4,3,0xf,0xf,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_f8,3,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a892);
  uVar3 = 0;
  crc_model_::crc_model_(local_124,9,9,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_138,0x15,0x1f,0x1f,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_14c,5,0x1f,0x1f,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19a984);
  uVar3 = 0;
  crc_model_::crc_model_(local_17c,0x27,0x3f,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_190,2,0x3f,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_1a4,0x19,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_1b8,3,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19aab5);
  uVar3 = 0;
  crc_model_::crc_model_(local_1e4,9,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_1f8,0x4f,0x7f,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_20c,0x45,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19aba4);
  uVar3 = 0;
  crc_model_::crc_model_(local_23c,7,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_250,0x2f,0xff,0xff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_264,0x9b,0xff,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_278,0x39,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_28c,0xd5,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_2a0,0x1d,0xff,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_2b4,0x1d,0xfd,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_2c8,7,0,0xff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_2dc,0x9b,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_2f0,0x31,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_304,0x2f,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_318,7,0xff,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_32c,0x1d,0xff,0xff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_340,0x9b,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19af6a);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19af95);
  uVar3 = 0;
  crc_model_::crc_model_(local_384,0x233,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_398,0x3d9,0x3ff,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_3ac,0xbd,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19b082);
  uVar3 = 0;
  crc_model_::crc_model_(local_3dc,0x385,0x1a,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_3f0,0x307,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19b12f);
  uVar3 = 0;
  crc_model_::crc_model_(local_41c,0xf13,0xfff,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_430,0x80f,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_444,0x80f,0,0,false,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19b21f);
  uVar3 = 0;
  crc_model_::crc_model_(local_474,0x1cf5,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19b28a);
  uVar3 = 0;
  crc_model_::crc_model_(local_4a4,0x805,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19b2f6);
  uVar3 = 0;
  crc_model_::crc_model_(local_4d4,0x4599,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_4e8,0x6815,0,1,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19b3a3);
  uVar3 = 0;
  crc_model_::crc_model_(local_514,0x8005,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_528,0x1021,0x1d0f,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_53c,0x8005,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_550,0x1021,0xffff,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_564,0xc867,0xffff,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_578,0x8005,0xffff,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_58c,0x8005,0x800d,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_5a0,0x589,0,1,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_5b4,0x589,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_5c8,0x3d65,0,0xffff,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_5dc,0x3d65,0,0xffff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_5f0,0x1021,0xffff,0xffff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_604,0x6f63,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_618,0x8005,0,0xffff,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_62c,0x1021,0xffff,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_640,0x5935,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_654,0x755b,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_668,0x1dcf,0xffff,0xffff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_67c,0x1021,0xb2aa,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_690,0x8bb7,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_6a4,0xa097,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_6b8,0x1021,0x89ec,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_6cc,0x8005,0xffff,0xffff,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_6e0,0x1021,0xc6c6,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_6f4,0x1021,0,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_708,0x8005,0xffff,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_71c,0x1021,0xffff,0xffff,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_730,0x1021,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bb0c);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bb3c);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bb69);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bb96);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bbc3);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bbf0);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bc1d);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bc45);
  uVar3 = 0;
  crc_model_::crc_model_(local_804,0x864cfb,0xb704ce,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_818,0x65b,0xffffff,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_82c,0x5d6dcb,0xfedcba,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_840,0x5d6dcb,0xabcdef,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_854,0x328b63,0xffffff,0xffffff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_868,0x864cfb,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_87c,0x800064,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19be40);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19be6d);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19be9a);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bec7);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bef4);
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bf1c);
  uVar3 = 0;
  crc_model_::crc_model_(local_924,0x2030b8c7,0x3fffffff,0x3fffffff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bf88);
  uVar3 = 0;
  crc_model_::crc_model_(local_954,0x4c11db7,0x7fffffff,0x7fffffff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)0x19bff4);
  uVar3 = 0;
  crc_model_::crc_model_(local_984,0x4c11db7,0xffffffff,0xffffffff,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_998,0xf4acfb13,0xffffffff,0xffffffff,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_9ac,0x4c11db7,0xffffffff,0xffffffff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_9c0,0x1edc6f31,0xffffffff,0xffffffff,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_9d4,0xa833982b,0xffffffff,0xffffffff,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_9e8,0x4c11db7,0xffffffff,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_9fc,0x4c11db7,0,0xffffffff,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_a10,0x814141ab,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_a24,0x4c11db7,0xffffffff,0,true,true,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  uVar3 = 0;
  crc_model_::crc_model_(&local_a38,0xaf,0,0,false,false,AUTO);
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::push_back
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff504,uVar2),
             (value_type *)CONCAT44(in_stack_fffffffffffff4fc,uVar3));
  std::
  vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
  ::push_back((vector<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>,_std::allocator<std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff514,in_stack_00000020),
              (value_type *)
              CONCAT17(in_stack_fffffffffffff50f,
                       CONCAT16(in_stack_fffffffffffff50e,
                                CONCAT15(in_stack_fffffffffffff50d,
                                         CONCAT14(in_stack_fffffffffffff50c,uVar1)))));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  std::vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_>::~vector
            ((vector<bf_crc::crc_model_,_std::allocator<bf_crc::crc_model_>_> *)
             CONCAT44(in_stack_fffffffffffff514,in_stack_00000020));
  return;
}

Assistant:

bf_crc(	uint16_t crc_width, 
				uint32_t polynomial, 
				bool probe_final_xor, 
				uint32_t final_xor, 
				bool probe_initial, 
				uint32_t initial, 
				bool probe_reflected_input, 
			bool probe_reflected_output,
			my_crc_basic::FEED_TYPE feed_type) {
			set_parameters(	crc_width, 
							polynomial, 
							probe_final_xor, 
							final_xor, 
							probe_initial, 
							initial, 
							probe_reflected_input, 
					probe_reflected_output, feed_type);
			crc_model_match_.clear();
			verbose_ = false;
			quiet_ = false;
			reflected_input_ = false;
			reflected_output_ = false;


			// Polulate known models from http://reveng.sourceforge.net
			std::vector<crc_model_t> crc_0;
			known_models.push_back(crc_0);

			std::vector<crc_model_t> crc_1;
			known_models.push_back(crc_1);

			std::vector<crc_model_t> crc_2;
			known_models.push_back(crc_2);

			std::vector<crc_model_t> crc_3;
			{
				// width=3 poly=0x3 init=0x7 refin=true refout=true xorout=0x0 check=0x6 name="CRC-3/ROHC"
			  crc_3.push_back(crc_model_t(0x3, 0x7, 0x0, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_3);

			std::vector<crc_model_t> crc_4;
			{
				// width=4 poly=0x3 init=0xf refin=false refout=false xorout=0xf check=0xb name="CRC-4/INTERLAKEN"
				crc_4.push_back(crc_model_t(0x3, 0xf, 0xf, false, false, my_crc_basic::AUTO));
				// width=4 poly=0x3 init=0x0 refin=true refout=true xorout=0x0 check=0x7 name="CRC-4/ITU"
				crc_4.push_back(crc_model_t(0x3, 0x0, 0x0, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_4);

			std::vector<crc_model_t> crc_5;
			{
				// width=5 poly=0x09 init=0x09 refin=false refout=false xorout=0x00 check=0x00 name="CRC-5/EPC"
				crc_5.push_back(crc_model_t(0x09, 0x9, 0x0, false, false, my_crc_basic::AUTO));
				// width=5 poly=0x15 init=0x00 refin=true refout=true xorout=0x00 check=0x07 name="CRC-5/ITU"
				crc_5.push_back(crc_model_t(0x15, 0x1f, 0x1f, true, true, my_crc_basic::AUTO));
				// width=5 poly=0x05 init=0x1f refin=true refout=true xorout=0x1f check=0x19 name="CRC-5/USB"
				crc_5.push_back(crc_model_t(0x05, 0x1f, 0x1f, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_5);

			std::vector<crc_model_t> crc_6;
			{
				// width=6 poly=0x27 init=0x3f refin=false refout=false xorout=0x00 check=0x0d name="CRC-6/CDMA2000-A"
				crc_6.push_back(crc_model_t(0x27, 0x3f, 0x00, false, false, my_crc_basic::AUTO));
				// width=6 poly=0x07 init=0x3f refin=false refout=false xorout=0x00 check=0x3b name="CRC-6/CDMA2000-B"
				crc_6.push_back(crc_model_t(0x02, 0x3f, 0x00, false, false, my_crc_basic::AUTO));
				// width=6 poly=0x19 init=0x00 refin=true refout=true xorout=0x00 check=0x26 name="CRC-6/DARC"
				crc_6.push_back(crc_model_t(0x19, 0x00, 0x00, true, true, my_crc_basic::AUTO));
				// width=6 poly=0x03 init=0x00 refin=true refout=true xorout=0x00 check=0x06 name="CRC-6/ITU"
				crc_6.push_back(crc_model_t(0x03, 0x00, 0x00, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_6);

			std::vector<crc_model_t> crc_7;
			{
				// width=7 poly=0x09 init=0x00 refin=false refout=false xorout=0x00 check=0x75 name="CRC-7"
				crc_7.push_back(crc_model_t(0x09, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=7 poly=0x4f init=0x7f refin=true refout=true xorout=0x00 check=0x53 name="CRC-7/ROHC"
				crc_7.push_back(crc_model_t(0x4f, 0x7f, 0x00, true, true, my_crc_basic::AUTO));
				// width=7 poly=0x45 init=0x00 refin=false refout=false xorout=0x00 check=0x61 name="CRC-7/UMTS"
				crc_7.push_back(crc_model_t(0x45, 0x00, 0x00, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_7);

			std::vector<crc_model_t> crc_8;
			{
				// width=8 poly=0x07 init=0x00 refin=false refout=false xorout=0x00 check=0xf4 name="CRC-8"
				crc_8.push_back(crc_model_t(0x07, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x2f init=0xff refin=false refout=false xorout=0xff check=0xdf name="CRC-8/AUTOSAR"
				crc_8.push_back(crc_model_t(0x2f, 0xff, 0xff, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x9b init=0xff refin=false refout=false xorout=0x00 check=0xda name="CRC-8/CDMA2000"
				crc_8.push_back(crc_model_t(0x9b, 0xff, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x39 init=0x00 refin=true refout=true xorout=0x00 check=0x15 name="CRC-8/DARC"
				crc_8.push_back(crc_model_t(0x39, 0x00, 0x00, true, true, my_crc_basic::AUTO));
				// width=8 poly=0xd5 init=0x00 refin=false refout=false xorout=0x00 check=0xbc name="CRC-8/DVB-S2"
				crc_8.push_back(crc_model_t(0xd5, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x1d init=0xff refin=true refout=true xorout=0x00 check=0x97 name="CRC-8/EBU"
				crc_8.push_back(crc_model_t(0x1d, 0xff, 0x00, true, true, my_crc_basic::AUTO));
				// width=8 poly=0x1d init=0xfd refin=false refout=false xorout=0x00 check=0x7e name="CRC-8/I-CODE"
				crc_8.push_back(crc_model_t(0x1d, 0xfd, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x07 init=0x00 refin=false refout=false xorout=0x55 check=0xa1 name="CRC-8/ITU"
				crc_8.push_back(crc_model_t(0x07, 0x00, 0xff, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x9b init=0x00 refin=false refout=false xorout=0x00 check=0xea name="CRC-8/LTE"
				crc_8.push_back(crc_model_t(0x9b, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x31 init=0x00 refin=true refout=true xorout=0x00 check=0xa1 name="CRC-8/MAXIM"
				crc_8.push_back(crc_model_t(0x31, 0x00, 0x00, true, true, my_crc_basic::AUTO));
				// width=8 poly=0x2f init=0x00 refin=false refout=false xorout=0x00 check=0x3e name="CRC-8/OPENSAFETY"
				crc_8.push_back(crc_model_t(0x2f, 0x00, 0x00, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x07 init=0xff refin=true refout=true xorout=0x00 check=0xd0 name="CRC-8/ROHC"
				crc_8.push_back(crc_model_t(0x07, 0xff, 0x00, true, true, my_crc_basic::AUTO));
				// width=8 poly=0x1d init=0xff refin=false refout=false xorout=0xff check=0x4b name="CRC-8/SAE-J1850"
				crc_8.push_back(crc_model_t(0x1d, 0xff, 0xff, false, false, my_crc_basic::AUTO));
				// width=8 poly=0x9b init=0x00 refin=true refout=true xorout=0x00 check=0x25 name="CRC-8/WCDMA"
				crc_8.push_back(crc_model_t(0x9b, 0x00, 0x00, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_8);

			std::vector<crc_model_t> crc_9;
			known_models.push_back(crc_9);

			std::vector<crc_model_t> crc_10;
			{	
				// width=10 poly=0x233 init=0x000 refin=false refout=false xorout=0x000 check=0x199 name="CRC-10"
				crc_10.push_back(crc_model_t(0x233, 0x000, 0x000, false, false, my_crc_basic::AUTO));
				// width=10 poly=0x3d9 init=0x3ff refin=false refout=false xorout=0x000 check=0x233 name="CRC-10/CDMA2000"
				crc_10.push_back(crc_model_t(0x3d9, 0x3ff, 0x000, false, false, my_crc_basic::AUTO));
				crc_10.push_back(crc_model_t(0x0bd, 0x00, 0x00, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_10);

			std::vector<crc_model_t> crc_11;
			{
				// width=11 poly=0x385 init=0x01a refin=false refout=false xorout=0x000 check=0x5a3 name="CRC-11"
				crc_11.push_back(crc_model_t(0x385, 0x01a, 0x000, false, false, my_crc_basic::AUTO));
				// width=11 poly=0x307 init=0x000 refin=false refout=false xorout=0x000 check=0x061 name="CRC-11/UMTS"
				crc_11.push_back(crc_model_t(0x307, 0x000, 0x000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_11);

			std::vector<crc_model_t> crc_12;
			{
				// width=12 poly=0xf13 init=0xfff refin=false refout=false xorout=0x000 check=0xd4d name="CRC-12/CDMA2000"
				crc_12.push_back(crc_model_t(0xf13, 0xfff, 0x000, false, false, my_crc_basic::AUTO));
				// width=12 poly=0x80f init=0x000 refin=false refout=false xorout=0x000 check=0xf5b name="CRC-12/DECT"
				crc_12.push_back(crc_model_t(0x80f, 0x000, 0x000, false ,false, my_crc_basic::AUTO));
				// width=12 poly=0x80f init=0x000 refin=false refout=true xorout=0x000 check=0xdaf name="CRC-12/UMTS"
				crc_12.push_back(crc_model_t(0x80f, 0x000, 0x000, false, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_12);

			std::vector<crc_model_t> crc_13;
			{
				// width=13 poly=0x1cf5 init=0x0000 refin=false refout=false xorout=0x0000 check=0x04fa name="CRC-13/BBC"
				crc_13.push_back(crc_model_t(0x1cf5, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_13);

			std::vector<crc_model_t> crc_14;
			{
				// width=14 poly=0x0805 init=0x0000 refin=true refout=true xorout=0x0000 check=0x082d name="CRC-14/DARC"
				crc_14.push_back(crc_model_t(0x0805, 0x0000, 0x0000, true, true, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_14);

			std::vector<crc_model_t> crc_15;
			{
				// width=15 poly=0x4599 init=0x0000 refin=false refout=false xorout=0x0000 check=0x059e name="CRC-15"
				crc_15.push_back(crc_model_t(0x4599, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				// width=15 poly=0x6815 init=0x0000 refin=false refout=false xorout=0x0001 check=0x2566 name="CRC-15/MPT1327"
				crc_15.push_back(crc_model_t(0x6815, 0x0000, 0x0001, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_15);

			std::vector<crc_model_t> crc_16;
			{
				//width=16 poly=0x8005 init=0x0000 refin=true refout=true xorout=0x0000 check=0xbb3d name="ARC"
				crc_16.push_back(crc_model_t(0x8005, 0x0000, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0x1d0f refin=false refout=false xorout=0x0000 check=0xe5cc name="CRC-16/AUG-CCITT"
				crc_16.push_back(crc_model_t(0x1021, 0x1d0f, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0x0000 refin=false refout=false xorout=0x0000 check=0xfee8 name="CRC-16/BUYPASS"
				crc_16.push_back(crc_model_t(0x8005, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xffff refin=false refout=false xorout=0x0000 check=0x29b1 name="CRC-16/CCITT-FALSE"
				crc_16.push_back(crc_model_t(0x1021, 0xffff, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0xc867 init=0xffff refin=false refout=false xorout=0x0000 check=0x4c06 name="CRC-16/CDMA2000"
				crc_16.push_back(crc_model_t(0xc867, 0xffff, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0xffff refin=false refout=false xorout=0x0000 check=0xaee7 name="CRC-16/CMS"
				crc_16.push_back(crc_model_t(0x8005, 0xffff, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0x800d refin=false refout=false xorout=0x0000 check=0x9ecf name="CRC-16/DDS-110"
				crc_16.push_back(crc_model_t(0x8005, 0x800d, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x0589 init=0x0000 refin=false refout=false xorout=0x0001 check=0x007e name="CRC-16/DECT-R"
				crc_16.push_back(crc_model_t(0x0589, 0x0000, 0x0001, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x0589 init=0x0000 refin=false refout=false xorout=0x0000 check=0x007f name="CRC-16/DECT-X"
				crc_16.push_back(crc_model_t(0x0589, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x3d65 init=0x0000 refin=true refout=true xorout=0xffff check=0xea82 name="CRC-16/DNP"
				crc_16.push_back(crc_model_t(0x3d65, 0x0000, 0xffff, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x3d65 init=0x0000 refin=false refout=false xorout=0xffff check=0xc2b7 name="CRC-16/EN-13757"
				crc_16.push_back(crc_model_t(0x3d65, 0x0000, 0xffff, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xffff refin=false refout=false xorout=0xffff check=0xd64e name="CRC-16/GENIBUS"
				crc_16.push_back(crc_model_t(0x1021, 0xffff, 0xffff, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x6f63 init=0x0000 refin=false refout=false xorout=0x0000 check=0xbdf4 name="CRC-16/LJ1200"
				crc_16.push_back(crc_model_t(0x6f63, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0x0000 refin=true refout=true xorout=0xffff check=0x44c2 name="CRC-16/MAXIM"
				crc_16.push_back(crc_model_t(0x8005, 0x0000, 0xffff, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xffff refin=true refout=true xorout=0x0000 check=0x6f91 name="CRC-16/MCRF4XX"
				crc_16.push_back(crc_model_t(0x1021, 0xffff, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x5935 init=0x0000 refin=false refout=false xorout=0x0000 check=0x5d38 name="CRC-16/OPENSAFETY-A"
				crc_16.push_back(crc_model_t(0x5935, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x755b init=0x0000 refin=false refout=false xorout=0x0000 check=0x20fe name="CRC-16/OPENSAFETY-B"
				crc_16.push_back(crc_model_t(0x755b, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1dcf init=0xffff refin=false refout=false xorout=0xffff check=0xa819 name="CRC-16/PROFIBUS"
				crc_16.push_back(crc_model_t(0x1dcf, 0xffff, 0xffff, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xb2aa refin=true refout=true xorout=0x0000 check=0x63d0 name="CRC-16/RIELLO"
				crc_16.push_back(crc_model_t(0x1021, 0xb2aa, 0x0000, true, true, my_crc_basic::AUTO));
				///width=16 poly=0x8bb7 init=0x0000 refin=false refout=false xorout=0x0000 check=0xd0db name="CRC-16/T10-DIF"
				crc_16.push_back(crc_model_t(0x8bb7, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0xa097 init=0x0000 refin=false refout=false xorout=0x0000 check=0x0fb3 name="CRC-16/TELEDISK"
				crc_16.push_back(crc_model_t(0xa097, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0x89ec refin=true refout=true xorout=0x0000 check=0x26b1 name="CRC-16/TMS37157"
				crc_16.push_back(crc_model_t(0x1021, 0x89ec, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0xffff refin=true refout=true xorout=0xffff check=0xb4c8 name="CRC-16/USB"
				crc_16.push_back(crc_model_t(0x8005, 0xffff, 0xffff, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xc6c6 refin=true refout=true xorout=0x0000 check=0xbf05 name="CRC-A"
				crc_16.push_back(crc_model_t(0x1021, 0xc6c6, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0x0000 refin=true refout=true xorout=0x0000 check=0x2189 name="KERMIT"
				crc_16.push_back(crc_model_t(0x1021, 0x0000, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x8005 init=0xffff refin=true refout=true xorout=0x0000 check=0x4b37 name="MODBUS"
				crc_16.push_back(crc_model_t(0x8005, 0xffff, 0x0000, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0xffff refin=true refout=true xorout=0xffff check=0x906e name="X-25"
				crc_16.push_back(crc_model_t(0x1021, 0xffff, 0xffff, true, true, my_crc_basic::AUTO));
				//width=16 poly=0x1021 init=0x0000 refin=false refout=false xorout=0x0000 check=0x31c3 name="XMODEM"	
				crc_16.push_back(crc_model_t(0x1021, 0x0000, 0x0000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_16);

			std::vector<crc_model_t> crc_17;
			known_models.push_back(crc_17);
	
			std::vector<crc_model_t> crc_18;
			known_models.push_back(crc_18);

			std::vector<crc_model_t> crc_19;
			known_models.push_back(crc_19);

			std::vector<crc_model_t> crc_20;
			known_models.push_back(crc_20);

			std::vector<crc_model_t> crc_21;
			known_models.push_back(crc_21);

			std::vector<crc_model_t> crc_22;
			known_models.push_back(crc_22);

			std::vector<crc_model_t> crc_23;
			known_models.push_back(crc_23);

			std::vector<crc_model_t> crc_24;
			{
				// width=24 poly=0x864cfb init=0xb704ce refin=false refout=false xorout=0x000000 check=0x21cf02 name="CRC-24"
				crc_24.push_back(crc_model_t(0x864cfb, 0xb704ce, 0x000000, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x00065b init=0x555555 refin=true refout=true xorout=0x000000 check=0xc25a56 name="CRC-24/BLE"
				crc_24.push_back(crc_model_t(0x00065b, 0xffffff, 0x000000, true, true, my_crc_basic::AUTO));
				// width=24 poly=0x5d6dcb init=0xfedcba refin=false refout=false xorout=0x000000 check=0x7979bd name="CRC-24/FLEXRAY-A"
				crc_24.push_back(crc_model_t(0x5d6dcb, 0xfedcba, 0x000000, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x5d6dcb init=0xabcdef refin=false refout=false xorout=0x000000 check=0x1f23b8 name="CRC-24/FLEXRAY-B"
				crc_24.push_back(crc_model_t(0x5d6dcb, 0xabcdef, 0x000000, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x328b63 init=0xffffff refin=false refout=false xorout=0xffffff check=0xb4f3e6 name="CRC-24/INTERLAKEN"
				crc_24.push_back(crc_model_t(0x328b63, 0xffffff, 0xffffff, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x864cfb init=0x000000 refin=false refout=false xorout=0x000000 check=0xcde703 name="CRC-24/LTE-A"
				crc_24.push_back(crc_model_t(0x864cfb, 0x000000, 0x000000, false, false, my_crc_basic::AUTO));
				// width=24 poly=0x800063 init=0x000000 refin=false refout=false xorout=0x000000 check=0x23ef52 name="CRC-24/LTE-B"
				crc_24.push_back(crc_model_t(0x800064, 0x000000, 0x000000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_24);

			std::vector<crc_model_t> crc_25;
			known_models.push_back(crc_25);

			std::vector<crc_model_t> crc_26;
			known_models.push_back(crc_26);

			std::vector<crc_model_t> crc_27;
			known_models.push_back(crc_27);

			std::vector<crc_model_t> crc_28;
			known_models.push_back(crc_28);

			std::vector<crc_model_t> crc_29;
			known_models.push_back(crc_29);


			std::vector<crc_model_t> crc_30;
			{
				// width=30 poly=0x2030b9c7 init=0x3fffffff refin=false refout=false xorout=0x3fffffff check=0x04c34abf name="CRC-30/CDMA"
				crc_30.push_back(crc_model_t(0x2030b8c7, 0x3fffffff, 0x3fffffff, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_30);

			std::vector<crc_model_t> crc_31;
			{
				// width=31 poly=0x04c11db7 init=0x7fffffff refin=false refout=false xorout=0x7fffffff check=0x0ce9e46c name="CRC-31/PHILIPS"
				crc_31.push_back(crc_model_t(0x04c11db7, 0x7fffffff, 0x7fffffff, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_31);

			std::vector<crc_model_t> crc_32;
			{
				// width=32 poly=0x04c11db7 init=0xffffffff refin=true refout=true xorout=0xffffffff check=0xcbf43926 name="CRC-32"
				crc_32.push_back(crc_model_t(0x04c11db7, 0xffffffff, 0xffffffff, true, true, my_crc_basic::AUTO));
				// width=32 poly=0xf4acfb13 init=0xffffffff refin=true refout=true xorout=0xffffffff check=0x1697d06a name="CRC-32/AUTOSAR"
				crc_32.push_back(crc_model_t(0xf4acfb13, 0xffffffff, 0xffffffff, true, true, my_crc_basic::AUTO));
				// width=32 poly=0x04c11db7 init=0xffffffff refin=false refout=false xorout=0xffffffff check=0xfc891918 name="CRC-32/BZIP2"
				crc_32.push_back(crc_model_t(0x04c11db7, 0xffffffff, 0xffffffff, false, false, my_crc_basic::AUTO));
				// width=32 poly=0x1edc6f41 init=0xffffffff refin=true refout=true xorout=0xffffffff check=0xe3069283 name="CRC-32C"
				crc_32.push_back(crc_model_t(0x1edc6f31, 0xffffffff, 0xffffffff, true, true, my_crc_basic::AUTO));
				// width=32 poly=0xa833982b init=0xffffffff refin=true refout=true xorout=0xffffffff check=0x87315576 name="CRC-32D"
				crc_32.push_back(crc_model_t(0xa833982b, 0xffffffff, 0xffffffff, true, true, my_crc_basic::AUTO));
				// width=32 poly=0x04c11db7 init=0xffffffff refin=false refout=false xorout=0x00000000 check=0x0376e6e7 name="CRC-32/MPEG-2"
				crc_32.push_back(crc_model_t(0x04c11db7, 0xffffffff, 0x00000000, false, false, my_crc_basic::AUTO));
				// width=32 poly=0x04c11db7 init=0x00000000 refin=false refout=false xorout=0xffffffff check=0x765e7680 name="CRC-32/POSIX"
				crc_32.push_back(crc_model_t(0x04c11db7, 0x00000000, 0xffffffff, false, false, my_crc_basic::AUTO));
				// width=32 poly=0x814141ab init=0x00000000 refin=false refout=false xorout=0x00000000 check=0x3010bf7f name="CRC-32Q"
				crc_32.push_back(crc_model_t(0x814141ab, 0x00000000, 0x00000000, false, false, my_crc_basic::AUTO));
				// width=32 poly=0x04c11db7 init=0xffffffff refin=true refout=true xorout=0x00000000 check=0x340bc6d9 name="JAMCRC"
				crc_32.push_back(crc_model_t(0x04c11db7, 0xffffffff, 0x00000000, true, true, my_crc_basic::AUTO));
				// width=32 poly=0x000000af init=0x00000000 refin=false refout=false xorout=0x00000000 check=0xbd0be338 name="XFER"
				crc_32.push_back(crc_model_t(0x000000af, 0x00000000, 0x00000000, false, false, my_crc_basic::AUTO));
			}
			known_models.push_back(crc_32);

		}